

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionPort::IfcDistributionPort(IfcDistributionPort *this)

{
  *(undefined ***)&this->field_0x148 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcDistributionPort";
  IfcPort::IfcPort((IfcPort *)this,&PTR_construction_vtable_24__0089aed8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x89add0;
  *(undefined8 *)&this->field_0x148 = 0x89aec0;
  *(undefined8 *)&this->field_0x88 = 0x89adf8;
  *(undefined8 *)&this->field_0x98 = 0x89ae20;
  *(undefined8 *)&this->field_0xd0 = 0x89ae48;
  *(undefined8 *)&this->field_0x100 = 0x89ae70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x89ae98;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20 = 0;
  this->field_0x140 = 0;
  return;
}

Assistant:

IfcDistributionPort() : Object("IfcDistributionPort") {}